

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH54
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  Command_conflict *pCVar6;
  uint32_t uVar7;
  int iVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  long lVar16;
  byte bVar17;
  uint8_t *local_850;
  uint8_t *local_840;
  uint8_t *local_830;
  uint8_t *local_828;
  uint8_t *local_818;
  uint8_t *local_800;
  uint8_t *local_7f0;
  ulong local_7e8;
  ulong local_7e0;
  uint8_t *local_7d0;
  uint8_t *local_7c8;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_758;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command_conflict *orig_commands;
  size_t max_backward_limit;
  HasherHandle hasher_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_5f8;
  uint32_t delta;
  size_t nbits;
  size_t offset;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_4e2;
  uint32_t nbits_2;
  ushort local_4ba;
  int offset_1;
  uint16_t bits64;
  ushort local_492;
  size_t score_3;
  size_t len_3;
  size_t backward_1;
  uint *puStack_450;
  int i_1;
  uint32_t *bucket_1;
  size_t score_2;
  size_t len_2;
  size_t prev_ix_1;
  size_t cached_backward_1;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  int compare_char_1;
  uint32_t key_1;
  size_t cur_ix_masked_1;
  size_t best_len_in_1;
  H54 *self_1;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_370;
  size_t local_360;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_330;
  size_t local_320;
  size_t score_1;
  size_t len_1;
  size_t backward;
  uint *puStack_298;
  int i;
  uint32_t *bucket;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t cached_backward;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  int compare_char;
  uint32_t key;
  size_t cur_ix_masked;
  size_t best_len_in;
  H54 *self;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_1b8;
  size_t local_1a8;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_178;
  size_t local_168;
  uint8_t *local_100;
  size_t i_2;
  uint32_t off;
  uint32_t key_2;
  uint32_t off_2;
  uint32_t key_4;
  uint32_t off_1;
  uint32_t key_3;
  
  pCVar6 = commands;
  puVar9 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  pos_end = *last_insert_len;
  puVar10 = (uint8_t *)(position + num_bytes);
  local_7c8 = (uint8_t *)position;
  if (7 < num_bytes) {
    local_7c8 = (uint8_t *)((position + num_bytes) - 7);
  }
  iVar8 = 0x200;
  if (params->quality < 9) {
    iVar8 = 0x40;
  }
  lVar11 = (long)iVar8;
  gap = position + lVar11;
  puVar14 = (uint8_t *)position;
LAB_0013afc0:
  do {
    ringbuffer_local = puVar14;
    if (puVar10 <= ringbuffer_local + 8) {
      *last_insert_len = (size_t)(puVar10 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar6 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar10 - (long)ringbuffer_local;
    local_7d0 = puVar9;
    if (ringbuffer_local < puVar9) {
      local_7d0 = ringbuffer_local;
    }
    sr.score = 0;
    sr.len = 0;
    cached_backward = 0;
    uVar12 = (ulong)ringbuffer_local & ringbuffer_mask;
    uVar7 = HashBytesH54(ringbuffer + uVar12);
    uVar1 = ringbuffer[uVar12];
    best_len = 0x7e4;
    sr.score._0_4_ = 0;
    if ((ringbuffer_local + -(long)*dist_cache < ringbuffer_local) &&
       (uVar13 = ringbuffer_mask & 0xffffffff & (ulong)(ringbuffer_local + -(long)*dist_cache),
       uVar1 == ringbuffer[uVar13])) {
      local_178 = (ulong *)(ringbuffer + uVar12);
      limit2 = 0;
      x = (max_distance >> 3) + 1;
LAB_0013b29d:
      x = x - 1;
      if (x != 0) {
        if (*local_178 == *(ulong *)(ringbuffer + limit2 + uVar13)) break;
        iVar8 = 0;
        for (uVar13 = *local_178 ^ *(ulong *)(ringbuffer + limit2 + uVar13); (uVar13 & 1) == 0;
            uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          iVar8 = iVar8 + 1;
        }
        local_168 = ((ulong)(long)iVar8 >> 3) + limit2;
        goto LAB_0013b440;
      }
      matched = (max_distance & 7) + 1;
      while (matched = matched - 1, matched != 0) {
        if (ringbuffer[limit2 + uVar13] != (uint8_t)*local_178) {
          local_168 = limit2;
          goto LAB_0013b440;
        }
        local_178 = (ulong *)((long)local_178 + 1);
        limit2 = limit2 + 1;
      }
      local_168 = limit2;
LAB_0013b440:
      if ((3 < local_168) && (uVar13 = local_168 * 0x87 + 0x78f, 0x7e4 < uVar13)) {
        cached_backward = local_168;
        uVar1 = ringbuffer[uVar12 + local_168];
        sr.len = (long)*dist_cache;
        best_len = uVar13;
      }
    }
    puStack_298 = (uint *)(hasher + (ulong)uVar7 * 4 + 0x28);
    uVar2 = *puStack_298;
    backward._4_4_ = 0;
    sStack_758 = cached_backward;
    sr.distance = best_len;
    while( true ) {
      len = (size_t)uVar2;
      puStack_298 = puStack_298 + 1;
      if (3 < backward._4_4_) break;
      puVar14 = ringbuffer_local + -len;
      uVar13 = ringbuffer_mask & 0xffffffff & len;
      if ((uVar1 == ringbuffer[uVar13 + cached_backward]) &&
         (puVar14 != (uint8_t *)0x0 && puVar14 <= local_7d0)) {
        local_1b8 = (ulong *)(ringbuffer + uVar12);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_0013b643:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_1b8 == *(ulong *)(ringbuffer + limit2_1 + uVar13)) goto LAB_0013b6a5;
          iVar8 = 0;
          for (uVar13 = *local_1b8 ^ *(ulong *)(ringbuffer + limit2_1 + uVar13); (uVar13 & 1) == 0;
              uVar13 = uVar13 >> 1 | 0x8000000000000000) {
            iVar8 = iVar8 + 1;
          }
          local_1a8 = ((ulong)(long)iVar8 >> 3) + limit2_1;
          goto LAB_0013b7e6;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar13] != (uint8_t)*local_1b8) {
            local_1a8 = limit2_1;
            goto LAB_0013b7e6;
          }
          local_1b8 = (ulong *)((long)local_1b8 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_1a8 = limit2_1;
LAB_0013b7e6:
        if (3 < local_1a8) {
          iVar8 = 0x1f;
          if ((uint)puVar14 != 0) {
            for (; (uint)puVar14 >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          uVar13 = (local_1a8 * 0x87 + 0x780) - (ulong)(uint)(iVar8 * 0x1e);
          if (best_len < uVar13) {
            cached_backward = local_1a8;
            sStack_758 = local_1a8;
            uVar1 = ringbuffer[uVar12 + local_1a8];
            sr.len = (size_t)puVar14;
            sr.distance = uVar13;
            best_len = uVar13;
          }
        }
      }
      backward._4_4_ = backward._4_4_ + 1;
      uVar2 = *puStack_298;
    }
    *(int *)(hasher + ((ulong)uVar7 + ((ulong)ringbuffer_local >> 3 & 3)) * 4 + 0x28) =
         (int)ringbuffer_local;
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      do {
        max_distance = max_distance - 1;
        if (params->quality < 5) {
          local_7e0 = sStack_758 - 1;
          if (max_distance <= local_7e0) {
            local_7e0 = max_distance;
          }
          local_7e8 = local_7e0;
        }
        else {
          local_7e8 = 0;
        }
        sr2.len = 0;
        local_7f0 = puVar9;
        if (ringbuffer_local + 1 < puVar9) {
          local_7f0 = ringbuffer_local + 1;
        }
        puVar14 = ringbuffer_local + 1;
        cached_backward_1 = local_7e8;
        uVar12 = (ulong)puVar14 & ringbuffer_mask;
        uVar7 = HashBytesH54(ringbuffer + uVar12);
        uVar1 = ringbuffer[uVar12 + local_7e8];
        best_len_1 = 0x7e4;
        if ((puVar14 + -(long)*dist_cache < puVar14) &&
           (uVar13 = ringbuffer_mask & 0xffffffff & (ulong)(puVar14 + -(long)*dist_cache),
           uVar1 == ringbuffer[uVar13 + local_7e8])) {
          local_330 = (ulong *)(ringbuffer + uVar12);
          limit2_2 = 0;
          x_2 = (max_distance >> 3) + 1;
LAB_0013bca6:
          x_2 = x_2 - 1;
          if (x_2 != 0) {
            if (*local_330 == *(ulong *)(ringbuffer + limit2_2 + uVar13)) goto LAB_0013bd08;
            iVar8 = 0;
            for (uVar13 = *local_330 ^ *(ulong *)(ringbuffer + limit2_2 + uVar13); (uVar13 & 1) == 0
                ; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
              iVar8 = iVar8 + 1;
            }
            local_320 = ((ulong)(long)iVar8 >> 3) + limit2_2;
            goto LAB_0013be49;
          }
          matched_2 = (max_distance & 7) + 1;
          while (matched_2 = matched_2 - 1, matched_2 != 0) {
            if (ringbuffer[limit2_2 + uVar13] != (uint8_t)*local_330) {
              local_320 = limit2_2;
              goto LAB_0013be49;
            }
            local_330 = (ulong *)((long)local_330 + 1);
            limit2_2 = limit2_2 + 1;
          }
          local_320 = limit2_2;
LAB_0013be49:
          if ((3 < local_320) && (uVar13 = local_320 * 0x87 + 0x78f, 0x7e4 < uVar13)) {
            cached_backward_1 = local_320;
            uVar1 = ringbuffer[uVar12 + local_320];
            sr2.len = (long)*dist_cache;
            best_len_1 = uVar13;
          }
        }
        puStack_450 = (uint *)(hasher + (ulong)uVar7 * 4 + 0x28);
        uVar2 = *puStack_450;
        backward_1._4_4_ = 0;
        distance_code = cached_backward_1;
        sr2.distance = best_len_1;
        while( true ) {
          len_2 = (size_t)uVar2;
          puStack_450 = puStack_450 + 1;
          if (3 < backward_1._4_4_) break;
          puVar15 = puVar14 + -len_2;
          uVar13 = ringbuffer_mask & 0xffffffff & len_2;
          if ((uVar1 == ringbuffer[uVar13 + cached_backward_1]) &&
             (puVar15 != (uint8_t *)0x0 && puVar15 <= local_7f0)) {
            local_370 = (ulong *)(ringbuffer + uVar12);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_0013c04c:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_370 == *(ulong *)(ringbuffer + limit2_3 + uVar13)) goto LAB_0013c0ae;
              iVar8 = 0;
              for (uVar13 = *local_370 ^ *(ulong *)(ringbuffer + limit2_3 + uVar13);
                  (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                iVar8 = iVar8 + 1;
              }
              local_360 = ((ulong)(long)iVar8 >> 3) + limit2_3;
              goto LAB_0013c1ef;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar13] != (uint8_t)*local_370) {
                local_360 = limit2_3;
                goto LAB_0013c1ef;
              }
              local_370 = (ulong *)((long)local_370 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_360 = limit2_3;
LAB_0013c1ef:
            if (3 < local_360) {
              iVar8 = 0x1f;
              if ((uint)puVar15 != 0) {
                for (; (uint)puVar15 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                }
              }
              uVar13 = (local_360 * 0x87 + 0x780) - (ulong)(uint)(iVar8 * 0x1e);
              if (best_len_1 < uVar13) {
                cached_backward_1 = local_360;
                distance_code = local_360;
                uVar1 = ringbuffer[uVar12 + local_360];
                sr2.len = (size_t)puVar15;
                sr2.distance = uVar13;
                best_len_1 = uVar13;
              }
            }
          }
          backward_1._4_4_ = backward_1._4_4_ + 1;
          uVar2 = *puStack_450;
        }
        *(int *)(hasher + ((ulong)uVar7 + ((ulong)puVar14 >> 3 & 3)) * 4 + 0x28) = (int)puVar14;
        puVar14 = ringbuffer_local;
        if (sr2.distance < sr.distance + 0xaf) goto LAB_0013c3ec;
        puVar14 = ringbuffer_local + 1;
        pos_end = pos_end + 1;
        sStack_758 = distance_code;
        sr.len = sr2.len;
        sr.distance = sr2.distance;
        sr.score = 0;
        sr.score._0_4_ = 0;
        cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
        if ((3 < cost_diff_lazy._4_4_) ||
           (puVar15 = ringbuffer_local + 9, ringbuffer_local = puVar14, puVar10 <= puVar15))
        goto LAB_0013c3ec;
      } while( true );
    }
    pos_end = pos_end + 1;
    puVar14 = ringbuffer_local + 1;
    if (gap < puVar14) {
      if ((uint8_t *)(gap + lVar11 * 4) < puVar14) {
        puVar15 = ringbuffer_local + 0x11;
        local_840 = puVar10 + -7;
        ringbuffer_local = puVar14;
        if (puVar15 < local_840) {
          local_840 = puVar15;
        }
        for (; puVar14 = ringbuffer_local, ringbuffer_local < local_840;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar7 = HashBytesH54(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          *(int *)(hasher + (ulong)(uVar7 + ((uint)((ulong)ringbuffer_local >> 3) & 3)) * 4 + 0x28)
               = (int)ringbuffer_local;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar15 = ringbuffer_local + 9;
        local_850 = puVar10 + -7;
        ringbuffer_local = puVar14;
        if (puVar15 < local_850) {
          local_850 = puVar15;
        }
        for (; puVar14 = ringbuffer_local, ringbuffer_local < local_850;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar7 = HashBytesH54(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          *(int *)(hasher + (ulong)(uVar7 + ((uint)((ulong)ringbuffer_local >> 3) & 3)) * 4 + 0x28)
               = (int)ringbuffer_local;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
  local_178 = local_178 + 1;
  limit2 = limit2 + 8;
  goto LAB_0013b29d;
LAB_0013bd08:
  local_330 = local_330 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0013bca6;
LAB_0013c3ec:
  ringbuffer_local = puVar14;
  gap = (size_t)(ringbuffer_local + lVar11 + sStack_758 * 2);
  local_800 = puVar9;
  if (ringbuffer_local < puVar9) {
    local_800 = ringbuffer_local;
  }
  if (sr.len <= local_800) {
    uVar12 = (sr.len + 3) - (long)*dist_cache;
    uVar13 = (sr.len + 3) - (long)dist_cache[1];
    if (sr.len == (long)*dist_cache) {
      local_5f8 = 0;
      goto LAB_0013c60f;
    }
    if (sr.len == (long)dist_cache[1]) {
      local_5f8 = 1;
      goto LAB_0013c60f;
    }
    if (uVar12 < 7) {
      local_5f8 = (ulong)(int)(0x9750468 >> ((byte)((uVar12 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0013c60f;
    }
    if (uVar13 < 7) {
      local_5f8 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar13 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0013c60f;
    }
    if (sr.len == (long)dist_cache[2]) {
      local_5f8 = 2;
      goto LAB_0013c60f;
    }
    if (sr.len == (long)dist_cache[3]) {
      local_5f8 = 3;
      goto LAB_0013c60f;
    }
  }
  local_5f8 = sr.len + 0xf;
LAB_0013c60f:
  if ((sr.len <= local_800) && (local_5f8 != 0)) {
    dist_cache[3] = dist_cache[2];
    dist_cache[2] = dist_cache[1];
    dist_cache[1] = *dist_cache;
    *dist_cache = (int)sr.len;
  }
  uVar7 = (uint32_t)pos_end;
  commands->insert_len_ = uVar7;
  commands->copy_len_ = (uint)sStack_758 | (int)sr.score << 0x19;
  uVar2 = (params->dist).num_direct_distance_codes;
  uVar3 = (params->dist).distance_postfix_bits;
  if (local_5f8 < (ulong)uVar2 + 0x10) {
    commands->dist_prefix_ = (uint16_t)local_5f8;
    commands->dist_extra_ = 0;
  }
  else {
    bVar5 = (byte)uVar3;
    uVar12 = (1L << (bVar5 + 2 & 0x3f)) + ((local_5f8 - 0x10) - (ulong)uVar2);
    iVar8 = 0x1f;
    if ((uint)uVar12 != 0) {
      for (; (uint)uVar12 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    bVar17 = (byte)(iVar8 - 1U);
    uVar13 = uVar12 >> (bVar17 & 0x3f) & 1;
    lVar16 = (ulong)(iVar8 - 1U) - (ulong)uVar3;
    commands->dist_prefix_ =
         (short)lVar16 * 0x400 |
         (short)uVar2 + 0x10 + (short)((lVar16 + -1) * 2 + uVar13 << (bVar5 & 0x3f)) +
         ((ushort)uVar12 & (short)(1 << (bVar5 & 0x1f)) - 1U);
    commands->dist_extra_ = (uint32_t)(uVar12 - (uVar13 + 2 << (bVar17 & 0x3f)) >> (bVar5 & 0x3f));
  }
  iVar8 = (uint)sStack_758 + (int)sr.score;
  uVar12 = (ulong)iVar8;
  if (pos_end < 6) {
    local_4e2 = (ushort)pos_end;
  }
  else if (pos_end < 0x82) {
    iVar4 = 0x1f;
    if (uVar7 - 2 != 0) {
      for (; uVar7 - 2 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_4e2 = (short)(iVar4 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar4 + -1) & 0x3f)) + 2;
  }
  else if (pos_end < 0x842) {
    iVar4 = 0x1f;
    if (uVar7 - 0x42 != 0) {
      for (; uVar7 - 0x42 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_4e2 = (short)iVar4 + 10;
  }
  else if (pos_end < 0x1842) {
    local_4e2 = 0x15;
  }
  else if (pos_end < 0x5842) {
    local_4e2 = 0x16;
  }
  else {
    local_4e2 = 0x17;
  }
  if (uVar12 < 10) {
    local_4ba = (short)iVar8 - 2;
  }
  else if (uVar12 < 0x86) {
    iVar4 = 0x1f;
    if (iVar8 - 6U != 0) {
      for (; iVar8 - 6U >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_4ba = (short)(iVar4 + -1) * 2 + (short)(uVar12 - 6 >> ((byte)(iVar4 + -1) & 0x3f)) + 4;
  }
  else if (uVar12 < 0x846) {
    iVar4 = 0x1f;
    if (iVar8 - 0x46U != 0) {
      for (; iVar8 - 0x46U >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_4ba = (short)iVar4 + 0xc;
  }
  else {
    local_4ba = 0x17;
  }
  local_492 = local_4ba & 7 | (local_4e2 & 7) << 3;
  if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_4e2 < 8)) && (local_4ba < 0x10)) {
    if (7 < local_4ba) {
      local_492 = local_492 | 0x40;
    }
  }
  else {
    iVar8 = ((int)(uint)local_4ba >> 3) + ((int)(uint)local_4e2 >> 3) * 3;
    local_492 = (short)iVar8 * 0x40 + 0x40 +
                ((ushort)(0x520d40 >> ((char)iVar8 * '\x02' & 0x1fU)) & 0xc0) | local_492;
  }
  commands->cmd_prefix_ = local_492;
  *num_literals = pos_end + *num_literals;
  pos_end = 0;
  range_end = (size_t)(ringbuffer_local + 2);
  local_818 = ringbuffer_local + sStack_758;
  if (local_7c8 <= local_818) {
    local_818 = local_7c8;
  }
  if (sr.len < sStack_758 >> 2) {
    local_828 = ringbuffer_local + sr.len * -4 + sStack_758;
    if (local_828 < range_end) {
      local_828 = (uint8_t *)range_end;
    }
    if (local_818 < local_828) {
      local_830 = local_818;
    }
    else {
      local_830 = local_828;
    }
    range_end = (size_t)local_830;
  }
  for (local_100 = (uint8_t *)range_end; local_100 < local_818; local_100 = local_100 + 1) {
    uVar7 = HashBytesH54(ringbuffer + ((ulong)local_100 & ringbuffer_mask));
    *(int *)(hasher + (ulong)(uVar7 + ((uint)((ulong)local_100 >> 3) & 3)) * 4 + 0x28) =
         (int)local_100;
  }
  commands = commands + 1;
  puVar14 = ringbuffer_local + sStack_758;
  goto LAB_0013afc0;
LAB_0013c0ae:
  local_370 = local_370 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_0013c04c;
LAB_0013b6a5:
  local_1b8 = local_1b8 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0013b643;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}